

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O0

ProgramData *
deqp::gles3::Performance::anon_unknown_1::defaultProgramData
          (ProgramData *__return_storage_ptr__,CaseShaderType shaderType,string *funcDefs,
          string *mainStatements)

{
  ProgramSources *pPVar1;
  CaseShaderType shaderType_00;
  Vector<float,_4> local_5a0;
  Vector<float,_4> local_590;
  Vector<float,_4> local_580;
  Vector<float,_4> local_570;
  AttribSpec local_560;
  byte local_4fa;
  allocator<char> local_4f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  byte local_4d2;
  allocator<char> local_4d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  ShaderSource local_370;
  byte local_342;
  allocator<char> local_341;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  byte local_31a;
  allocator<char> local_319;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  ShaderSource local_178;
  ProgramSources local_150;
  undefined1 local_70 [8];
  string fragPrec;
  string vtxPrec;
  bool isFragmentCase;
  bool isVertexCase;
  string *mainStatements_local;
  string *funcDefs_local;
  CaseShaderType shaderType_local;
  
  Performance::(anonymous_namespace)::getShaderPrecision_abi_cxx11_
            ((string *)((long)&fragPrec.field_2 + 8),(_anonymous_namespace_ *)0x0,
             (CaseShaderType)funcDefs);
  Performance::(anonymous_namespace)::getShaderPrecision_abi_cxx11_
            ((string *)local_70,(_anonymous_namespace_ *)&DAT_00000001,shaderType_00);
  glu::ProgramSources::ProgramSources(&local_150);
  std::operator+(&local_2f8,"#version 300 es\nin ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&fragPrec.field_2 + 8));
  std::operator+(&local_2d8,&local_2f8," vec4 a_position;\nin ");
  std::operator+(&local_2b8,&local_2d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&fragPrec.field_2 + 8));
  std::operator+(&local_298,&local_2b8," vec4 a_value;\nout ");
  std::operator+(&local_278,&local_298,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  std::operator+(&local_258,&local_278," vec4 v_value;\n");
  local_31a = 0;
  if (shaderType != CASESHADERTYPE_VERTEX) {
    std::allocator<char>::allocator();
    local_31a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"",&local_319);
  }
  else {
    std::__cxx11::string::string((string *)&local_318,(string *)funcDefs);
  }
  std::operator+(&local_238,&local_258,&local_318);
  std::operator+(&local_218,&local_238,"void main (void)\n{\n\tgl_Position = a_position;\n\t");
  std::operator+(&local_1f8,&local_218,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&fragPrec.field_2 + 8));
  std::operator+(&local_1d8,&local_1f8," vec4 value = a_value;\n");
  local_342 = 0;
  if (shaderType != CASESHADERTYPE_VERTEX) {
    std::allocator<char>::allocator();
    local_342 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"",&local_341);
  }
  else {
    std::__cxx11::string::string((string *)&local_340,(string *)mainStatements);
  }
  std::operator+(&local_1b8,&local_1d8,&local_340);
  std::operator+(&local_198,&local_1b8,"\tv_value = value;\n}\n");
  glu::VertexSource::VertexSource((VertexSource *)&local_178,&local_198);
  pPVar1 = glu::ProgramSources::operator<<(&local_150,&local_178);
  std::operator+(&local_4b0,"#version 300 es\nlayout (location = 0) out ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  std::operator+(&local_490,&local_4b0," vec4 o_color;\nin ");
  std::operator+(&local_470,&local_490,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  std::operator+(&local_450,&local_470," vec4 v_value;\n");
  local_4d2 = 0;
  if (shaderType != CASESHADERTYPE_FRAGMENT) {
    std::allocator<char>::allocator();
    local_4d2 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,"",&local_4d1);
  }
  else {
    std::__cxx11::string::string((string *)&local_4d0,(string *)funcDefs);
  }
  std::operator+(&local_430,&local_450,&local_4d0);
  std::operator+(&local_410,&local_430,"void main (void)\n{\n\t");
  std::operator+(&local_3f0,&local_410,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  std::operator+(&local_3d0,&local_3f0," vec4 value = v_value;\n");
  local_4fa = 0;
  if (shaderType != CASESHADERTYPE_FRAGMENT) {
    std::allocator<char>::allocator();
    local_4fa = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f8,"",&local_4f9);
  }
  else {
    std::__cxx11::string::string((string *)&local_4f8,(string *)mainStatements);
  }
  std::operator+(&local_3b0,&local_3d0,&local_4f8);
  std::operator+(&local_390,&local_3b0,"\to_color = value;\n}\n");
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_370,&local_390);
  pPVar1 = glu::ProgramSources::operator<<(pPVar1,&local_370);
  tcu::Vector<float,_4>::Vector(&local_570,1.0,0.0,0.0,0.0);
  tcu::Vector<float,_4>::Vector(&local_580,0.0,1.0,0.0,0.0);
  tcu::Vector<float,_4>::Vector(&local_590,0.0,0.0,1.0,0.0);
  tcu::Vector<float,_4>::Vector(&local_5a0,0.0,0.0,0.0,1.0);
  deqp::gls::AttribSpec::AttribSpec
            (&local_560,"a_value",&local_570,&local_580,&local_590,&local_5a0);
  ProgramData::ProgramData(__return_storage_ptr__,pPVar1,&local_560);
  deqp::gls::AttribSpec::~AttribSpec(&local_560);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_370);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_4f8);
  if ((local_4fa & 1) != 0) {
    std::allocator<char>::~allocator(&local_4f9);
  }
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_4d0);
  if ((local_4d2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_4d1);
  }
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_4b0);
  glu::VertexSource::~VertexSource((VertexSource *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_340);
  if ((local_342 & 1) != 0) {
    std::allocator<char>::~allocator(&local_341);
  }
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_318);
  if ((local_31a & 1) != 0) {
    std::allocator<char>::~allocator(&local_319);
  }
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2f8);
  glu::ProgramSources::~ProgramSources(&local_150);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(fragPrec.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

static inline ProgramData defaultProgramData (CaseShaderType shaderType, const string& funcDefs, const string& mainStatements)
{
	const bool		isVertexCase	= shaderType == CASESHADERTYPE_VERTEX;
	const bool		isFragmentCase	= shaderType == CASESHADERTYPE_FRAGMENT;
	const string	vtxPrec			= getShaderPrecision(CASESHADERTYPE_VERTEX);
	const string	fragPrec		= getShaderPrecision(CASESHADERTYPE_FRAGMENT);

	return ProgramData(glu::ProgramSources() << glu::VertexSource(		"#version 300 es\n"
																		"in " + vtxPrec + " vec4 a_position;\n"
																		"in " + vtxPrec + " vec4 a_value;\n"
																		"out " + fragPrec + " vec4 v_value;\n"
																		+ (isVertexCase ? funcDefs : "") +
																		"void main (void)\n"
																		"{\n"
																		"	gl_Position = a_position;\n"
																		"	" + vtxPrec + " vec4 value = a_value;\n"
																		+ (isVertexCase ? mainStatements : "") +
																		"	v_value = value;\n"
																		"}\n")

											 << glu::FragmentSource(	"#version 300 es\n"
																		"layout (location = 0) out " + fragPrec + " vec4 o_color;\n"
																		"in " + fragPrec + " vec4 v_value;\n"
																		+ (isFragmentCase ? funcDefs : "") +
																		"void main (void)\n"
																		"{\n"
																		"	" + fragPrec + " vec4 value = v_value;\n"
																		+ (isFragmentCase ? mainStatements : "") +
																		"	o_color = value;\n"
																		"}\n"),
					  gls::AttribSpec("a_value",
									  Vec4(1.0f, 0.0f, 0.0f, 0.0f),
									  Vec4(0.0f, 1.0f, 0.0f, 0.0f),
									  Vec4(0.0f, 0.0f, 1.0f, 0.0f),
									  Vec4(0.0f, 0.0f, 0.0f, 1.0f)));
}